

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadraticquad.cpp
# Opt level: O0

void pzgeom::TPZQuadraticQuad::GradX<double>
               (TPZFMatrix<double> *nodes,TPZVec<double> *loc,TPZFMatrix<double> *gradx)

{
  double dVar1;
  double *pdVar2;
  long *in_RDX;
  TPZBaseMatrix *in_RDI;
  double extraout_XMM0_Qa;
  double row;
  int j;
  int i;
  TPZFNMatrix<6,_double> dphi;
  TPZFNMatrix<3,_double> phi;
  int ncol;
  int nrow;
  double *in_stack_fffffffffffffe10;
  double in_stack_fffffffffffffe18;
  TPZFNMatrix<6,_double> *in_stack_fffffffffffffe20;
  int local_1ac;
  int local_1a8;
  TPZFMatrix<double> *in_stack_fffffffffffffec0;
  TPZFMatrix<double> *in_stack_fffffffffffffec8;
  TPZVec<double> *in_stack_fffffffffffffed0;
  
  (**(code **)(*in_RDX + 0x68))(in_RDX,3);
  (**(code **)(*in_RDX + 0x78))();
  TPZBaseMatrix::Rows(in_RDI);
  TPZBaseMatrix::Cols(in_RDI);
  TPZFNMatrix<3,_double>::TPZFNMatrix
            ((TPZFNMatrix<3,_double> *)in_stack_fffffffffffffe20,(int64_t)in_stack_fffffffffffffe18,
             (int64_t)in_stack_fffffffffffffe10);
  TPZFNMatrix<6,_double>::TPZFNMatrix
            (in_stack_fffffffffffffe20,(int64_t)in_stack_fffffffffffffe18,
             (int64_t)in_stack_fffffffffffffe10);
  TShape<double>(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  for (local_1a8 = 0; local_1a8 < 8; local_1a8 = local_1a8 + 1) {
    for (local_1ac = 0; local_1ac < 3; local_1ac = local_1ac + 1) {
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_1ac,(long)local_1a8);
      pdVar2 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffffe20->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffffe18,(int64_t)in_stack_fffffffffffffe10);
      in_stack_fffffffffffffe20 = (TPZFNMatrix<6,_double> *)*pdVar2;
      pdVar2 = TPZFMatrix<double>::operator()
                         ((TPZFMatrix<double> *)in_stack_fffffffffffffe20,
                          (int64_t)in_stack_fffffffffffffe18,(int64_t)in_stack_fffffffffffffe10);
      *pdVar2 = extraout_XMM0_Qa * (double)in_stack_fffffffffffffe20 + *pdVar2;
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_1ac,(long)local_1a8);
      in_stack_fffffffffffffe18 = row;
      in_stack_fffffffffffffe10 =
           TPZFMatrix<double>::operator()
                     (&in_stack_fffffffffffffe20->super_TPZFMatrix<double>,(int64_t)row,
                      (int64_t)in_stack_fffffffffffffe10);
      dVar1 = *in_stack_fffffffffffffe10;
      pdVar2 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffffe20->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffffe18,(int64_t)in_stack_fffffffffffffe10);
      *pdVar2 = in_stack_fffffffffffffe18 * dVar1 + *pdVar2;
    }
  }
  TPZFNMatrix<6,_double>::~TPZFNMatrix((TPZFNMatrix<6,_double> *)0x179314e);
  TPZFNMatrix<3,_double>::~TPZFNMatrix((TPZFNMatrix<3,_double> *)0x179315b);
  return;
}

Assistant:

inline void TPZQuadraticQuad::GradX(const TPZFMatrix<REAL> &nodes,TPZVec<T> &loc, TPZFMatrix<T> &gradx){
    
    gradx.Resize(3,2);
    gradx.Zero();
    int nrow = nodes.Rows();
    int ncol = nodes.Cols();
#ifdef PZDEBUG
    if(nrow != 3 || ncol  != 8){
        std::cout << "Objects of incompatible lengths, gradient cannot be computed." << std::endl;
        std::cout << "nodes matrix must be 3x8." << std::endl;
        DebugStop();
    }
    
#endif
    TPZFNMatrix<3,T> phi(NNodes,1);
    TPZFNMatrix<6,T> dphi(2,NNodes);
    TShape(loc,phi,dphi);
    for(int i = 0; i < NNodes; i++)
    {
        for(int j = 0; j < 3; j++)
        {
            gradx(j,0) += nodes.GetVal(j,i)*dphi(0,i);
            gradx(j,1) += nodes.GetVal(j,i)*dphi(1,i);
        }
    }
    
}